

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

Module * __thiscall hgdb::json::SymbolTable::add_module(SymbolTable *this,string *name)

{
  reference this_00;
  pointer pMVar1;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  string *name_local;
  SymbolTable *this_local;
  
  local_30.field_2._8_8_ = name;
  name_local = &this->framework_name_;
  pVar2 = std::
          set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::emplace<std::__cxx11::string_const&>
                    ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->top_names_,name);
  local_30._M_string_length = (size_type)pVar2.first._M_node;
  local_30.field_2._M_local_buf[0] = pVar2.second;
  std::
  make_unique<hgdb::json::Module,std::__cxx11::string_const&,hgdb::json::SymbolTable::add_module(std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_>
            (&local_30,(anon_class_8_1_8991fb9c *)local_30.field_2._8_8_);
  this_00 = std::
            vector<std::unique_ptr<hgdb::json::Module,std::default_delete<hgdb::json::Module>>,std::allocator<std::unique_ptr<hgdb::json::Module,std::default_delete<hgdb::json::Module>>>>
            ::
            emplace_back<std::unique_ptr<hgdb::json::Module,std::default_delete<hgdb::json::Module>>>
                      ((vector<std::unique_ptr<hgdb::json::Module,std::default_delete<hgdb::json::Module>>,std::allocator<std::unique_ptr<hgdb::json::Module,std::default_delete<hgdb::json::Module>>>>
                        *)&this->modules_,
                       (unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *)
                       &local_30);
  pMVar1 = std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>::get
                     (this_00);
  std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>::~unique_ptr
            ((unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *)&local_30);
  return pMVar1;
}

Assistant:

Module *add_module(const std::string &name) {
        // no error check
        top_names_.emplace(name);
        return modules_
            .emplace_back(std::make_unique<Module>(
                name, [this](const std::string &name) { remove_module_top(name); }))
            .get();
    }